

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int input_deinit(void)

{
  int iVar1;
  GSList *pGVar2;
  GSList *pGVar3;
  
  pGVar2 = plugin_ops;
  pGVar3 = g_modules;
  if (g_modules != (GSList *)0x0 && plugin_ops != (GSList *)0x0) {
    do {
      if ((pGVar2->data != (gpointer)0x0) && (pGVar3->data != (gpointer)0x0)) {
        (**(code **)((long)pGVar2->data + 0x68))();
        iVar1 = g_module_close(pGVar3->data);
        if (iVar1 == 0) {
          input_deinit_cold_1();
        }
      }
      pGVar2 = pGVar2->next;
    } while ((pGVar2 != (GSList *)0x0) && (pGVar3 = pGVar3->next, pGVar3 != (GSList *)0x0));
  }
  g_slist_free(g_modules);
  g_slist_free(plugin_ops);
  g_slist_free(plugin_exts);
  return 0;
}

Assistant:

int
input_deinit(void)
{
	/* unload plugins */
	GSList *ops = plugin_ops;
	GSList *modules = g_modules;

	while (ops && modules) {
		if (ops->data && modules->data) {
			((struct input_ops *)ops->data)->exit_library();
			if (!g_module_close((GModule *)modules->data)) {
				fprintf(stderr, "%s\n", g_module_error());
			}
		}
		ops = g_slist_next(ops);
		modules = g_slist_next(modules);
	}
	g_slist_free(g_modules);
	g_slist_free(plugin_ops);
	g_slist_free(plugin_exts);
	return 0;
}